

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::appendUInt(Builder *this,uint64_t v,uint8_t base)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  ValueLength VVar3;
  bool bVar4;
  
  reserve(this,9);
  VVar2 = this->_pos;
  this->_pos = VVar2 + 1;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  do {
    VVar3 = this->_pos;
    this->_pos = VVar3 + 1;
    this->_start[VVar3] = (uint8_t)v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    base = base + '\x01';
    bVar4 = 0xff < v;
    v = v >> 8;
  } while (bVar4);
  this->_start[VVar2] = base;
  return;
}

Assistant:

void appendUInt(uint64_t v, uint8_t base) {
    reserve(9);
    ValueLength save = _pos;
    advance(1);
    uint8_t vSize = 0;
    do {
      vSize++;
      appendByteUnchecked(static_cast<uint8_t>(v & 0xff));
      v >>= 8;
    } while (v != 0);
    _start[save] = base + vSize;
  }